

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O2

void highsOpenLogFile(HighsOptions *options,string *log_file)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)log_file);
  highsOpenLogFile(&(options->super_HighsOptionsStruct).log_options,&options->records,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void highsOpenLogFile(HighsOptions& options, const std::string log_file) {
  highsOpenLogFile(options.log_options, options.records, log_file);
}